

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O1

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::resetEventInEventToDagID
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hEvent)

{
  __node_base_ptr p_Var1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  _Hash_node_base *p_Var8;
  
  uVar3 = (this->eventToDagID)._M_h._M_bucket_count;
  uVar4 = (ulong)hEvent % uVar3;
  p_Var6 = (this->eventToDagID)._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     (ze_event_handle_t)p_Var6->_M_nxt[1]._M_nxt != hEvent)) {
    while (p_Var6 = p_Var8, p_Var8 = p_Var6->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var8[1]._M_nxt % uVar3 != uVar4) ||
         (p_Var7 = p_Var6, (ze_event_handle_t)p_Var8[1]._M_nxt == hEvent)) goto LAB_001ae14d;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001ae14d:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var7->_M_nxt;
  }
  if (p_Var8 == (_Hash_node_base *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: hSignalEvent {",0x17);
    poVar2 = std::ostream::_M_insert<void_const*>(&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"} might be an invalid event in call to ",0x27);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(zeCallDisc->_M_dataplus)._M_p,zeCallDisc->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  uVar3 = (ulong)*(uint *)&p_Var8[2]._M_nxt;
  if (uVar3 != 0xffffffff) {
    p_Var5 = (_Hash_node_base *)0x0;
    p_Var1 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->dagIDToAction)._M_h,
                        uVar3 % (this->dagIDToAction)._M_h._M_bucket_count,
                        (key_type_conflict *)(p_Var8 + 2),uVar3);
    if (p_Var1 != (__node_base_ptr)0x0) {
      p_Var5 = p_Var1->_M_nxt;
    }
    if (p_Var5 != (_Hash_node_base *)0x0) {
      p_Var5[6]._M_nxt = (_Hash_node_base *)0x0;
    }
    *(undefined4 *)&p_Var8[2]._M_nxt = 0xffffffff;
  }
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::resetEventInEventToDagID(
    const std::string &zeCallDisc, /// action discription
    const ze_event_handle_t hEvent ///< [in] handle of the event
) {
    auto it = eventToDagID.find(hEvent);
    // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
    if (it == eventToDagID.end()) {
        std::cerr << "Warning: hSignalEvent {" << hEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
        return;
    }

    if (it->second != invalidDagID) {

        auto action = dagIDToAction.find(it->second);
        if (action != dagIDToAction.end()) {
            action->second.second = invalidEventAddress; // Reset
        }

        it->second = invalidDagID; // Reset
    }
}